

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMyString.cpp
# Opt level: O3

void StringTestMain(void)

{
  char *__src;
  uint uVar1;
  CMyString *CS;
  long lVar2;
  void *pvVar3;
  CMyString *s;
  int *__src_00;
  int iVar4;
  char cVar5;
  size_t sVar6;
  int iVar7;
  
  CS = (CMyString *)malloc(0x408);
  CS->length = 0;
  __src = CS->str;
  cVar5 = 'h';
  lVar2 = 4;
  do {
    CS->str[lVar2 + -4] = cVar5;
    CS->length = CS->length + 1;
    cVar5 = "The Intersection of VectorA and VectorB is:"[lVar2 + 0x29];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  CS->str[5] = '\0';
  sVar6 = (long)CS->length + 1;
  pvVar3 = malloc(sVar6);
  memcpy(pvVar3,__src,sVar6);
  printf("After initCMyString, the string is:%s\n",pvVar3);
  s = (CMyString *)malloc(0x408);
  s->length = 0;
  cVar5 = 'W';
  lVar2 = 4;
  do {
    s->str[lVar2 + -4] = cVar5;
    s->length = s->length + 1;
    cVar5 = "After initCMyString, the string is:%s\n"[lVar2 + 0x24];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  s->str[6] = '\0';
  Concatenate(CS,s);
  sVar6 = (long)CS->length + 1;
  pvVar3 = malloc(sVar6);
  memcpy(pvVar3,__src,sVar6);
  printf("After concatenate, the string is:%s\n",pvVar3);
  s->length = 0;
  cVar5 = 'N';
  lVar2 = 4;
  do {
    s->str[lVar2 + -4] = cVar5;
    s->length = s->length + 1;
    cVar5 = "After concatenate, the string is:%s\n"[lVar2 + 0x22];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  s->str[5] = '\0';
  InsertS(CS,5,s);
  iVar7 = CS->length;
  sVar6 = (long)iVar7 + 1;
  pvVar3 = malloc(sVar6);
  memcpy(pvVar3,__src,sVar6);
  printf("After inserting to the pos 5, the string is:%s\n",pvVar3);
  iVar4 = 6;
  if ((long)iVar7 < 0x10) {
    iVar4 = iVar7 + -10;
  }
  iVar7 = iVar7 - iVar4;
  CS->length = iVar7;
  memcpy(CS->str + 10,CS->str + (long)iVar4 + 10,(long)(iVar7 + -9));
  pvVar3 = malloc((long)(iVar7 + 1));
  memcpy(pvVar3,__src,(long)(iVar7 + 1));
  printf("After deleting the substring(pos:10,len:6),the string is:%s\n",pvVar3);
  __src_00 = (int *)malloc(0x408);
  iVar4 = 4;
  if (iVar7 < 9) {
    iVar4 = iVar7 + -5;
  }
  *(undefined2 *)(__src_00 + 1) = 0x20;
  memcpy(__src_00 + 1,CS->str + 5,(long)iVar4);
  *__src_00 = iVar4;
  *(undefined1 *)((long)__src_00 + (long)iVar4 + 4U) = 0;
  memcpy(s,__src_00,0x408);
  sVar6 = (long)s->length + 1;
  pvVar3 = malloc(sVar6);
  memcpy(pvVar3,s->str,sVar6);
  printf("The substring(pos:5,len:4) is:%s\n",pvVar3);
  s->length = 0;
  cVar5 = 'N';
  lVar2 = 4;
  do {
    s->str[lVar2 + -4] = cVar5;
    s->length = s->length + 1;
    cVar5 = "The substring(pos:5,len:4) is:%s\n"[lVar2 + 0x1f];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  s->str[4] = '\0';
  uVar1 = Find(CS,s);
  printf("The First occurrence of string NUDT is the pos %d\n",(ulong)uVar1);
  return;
}

Assistant:

void StringTestMain()
{
    CMyString *CS = (CMyString *)malloc(sizeof(CMyString));
    InitCMyString(CS,(char*)"hello");
    printf("After initCMyString, the string is:%s\n",GetS(CS));
    CMyString *tmp = (CMyString *)malloc(sizeof(CMyString));
    InitCMyString(tmp,(char*)"World.");
    Concatenate(CS,tmp);
    printf("After concatenate, the string is:%s\n",GetS(CS));
    InitCMyString(tmp,(char*)"NUDT.");
    InsertS(CS,5,tmp);
    printf("After inserting to the pos 5, the string is:%s\n",GetS(CS));
    DeleteS(CS,10,6);
    printf("After deleting the substring(pos:10,len:6),the string is:%s\n",GetS(CS));
    *tmp = SubString(CS,5,4);
    printf("The substring(pos:5,len:4) is:%s\n",GetS(tmp));
    InitCMyString(tmp,(char*)"NUDT");
    printf("The First occurrence of string NUDT is the pos %d\n",Find(CS,tmp));
}